

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
pstore::command_line::parser_base::add_literal_option
          (parser_base *this,string *name,int value,string *description)

{
  literal lStack_58;
  
  literal::literal(&lStack_58,name,value,description);
  std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>::
  emplace_back<pstore::command_line::literal>(&this->literals_,&lStack_58);
  literal::~literal(&lStack_58);
  return;
}

Assistant:

void parser_base::add_literal_option (std::string const & name, int const value,
                                                  std::string const & description) {
                literals_.emplace_back (literal{name, value, description});
            }